

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandTempor(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Cex_t *p;
  bool bVar1;
  int iVar2;
  uint fVeryVerbose;
  uint fVerbose;
  uint nFrames;
  uint uVar3;
  Abc_Ntk_t *pAVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  Abc_Cex_t *pCexNew;
  
  pAVar4 = Abc_FrameReadNtk(pAbc);
  nFrames = 0;
  Extra_UtilGetoptReset();
  local_64 = 1;
  local_68 = 100000;
  local_6c = 300;
  local_60 = 0;
  bVar1 = false;
  fVerbose = 0;
  fVeryVerbose = 0;
LAB_0020e03a:
  while (iVar2 = Extra_UtilGetopt(argc,argv,"FTCbscvwh"), iVar5 = globalUtilOptind, iVar2 == 0x43) {
    if (argc <= globalUtilOptind) {
      pcVar6 = "Command line switch \"-C\" should be followed by an integer.\n";
      goto LAB_0020e1c5;
    }
    local_68 = atoi(argv[globalUtilOptind]);
    uVar3 = local_68;
joined_r0x0020e128:
    globalUtilOptind = iVar5 + 1;
    if ((int)uVar3 < 0) {
LAB_0020e1cf:
      iVar5 = -2;
      Abc_Print(-2,"usage: tempor [-FTC <num>] [-bscvwh]\n");
      Abc_Print(-2,"\t           performs temporal decomposition\n");
      Abc_Print(-2,
                "\t-F <num> : init logic timeframe count (0 = use leading length) [default = %d]\n",
                (ulong)nFrames);
      Abc_Print(-2,"\t-T <num> : runtime limit in seconds for BMC (0=unused) [default = %d]\n",
                (ulong)local_6c);
      Abc_Print(-2,"\t-C <num> : max number of SAT conflicts in BMC (0=unused) [default = %d]\n",
                (ulong)local_68);
      pcVar7 = "yes";
      pcVar6 = "yes";
      if (local_64 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-b       : toggle running BMC2 on the init frames [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_60 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-s       : toggle using transient signals [default = %s]\n",pcVar6);
      Abc_Print(-2,"\t-c       : update the current CEX derived for a new AIG after \"tempor\"\n");
      pcVar6 = "yes";
      if (!bVar1) {
        pcVar6 = "no";
      }
      Abc_Print(-2,
                "\t           to match the current AIG (the one before \"tempor\") [default = %s]\n"
                ,pcVar6);
      pcVar6 = "yes";
      if (fVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle printing verbose output [default = %s]\n",pcVar6);
      if (fVeryVerbose == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-w       : toggle printing ternary state space [default = %s]\n",pcVar7);
      pcVar6 = "\t-h       : print the command usage\n";
LAB_0020e2e0:
      Abc_Print(iVar5,pcVar6);
      return 1;
    }
  }
  if (iVar2 == 0x46) {
    if (globalUtilOptind < argc) {
      nFrames = atoi(argv[globalUtilOptind]);
      uVar3 = nFrames;
      goto joined_r0x0020e128;
    }
    pcVar6 = "Command line switch \"-F\" should be followed by an integer.\n";
  }
  else {
    if (iVar2 != 0x54) {
      if (iVar2 == 0x62) {
        local_64 = local_64 ^ 1;
      }
      else if (iVar2 == 99) {
        bVar1 = (bool)(bVar1 ^ 1);
      }
      else if (iVar2 == 0x73) {
        local_60 = local_60 ^ 1;
      }
      else if (iVar2 == 0x76) {
        fVerbose = fVerbose ^ 1;
      }
      else {
        if (iVar2 != 0x77) {
          if (iVar2 == -1) {
            if (pAVar4 == (Abc_Ntk_t *)0x0) {
              pcVar6 = "There is no current network.\n";
            }
            else {
              if (pAVar4->ntkType == ABC_NTK_STRASH) {
                if (pAVar4->nObjCounts[8] == 0) {
                  pcVar6 = "The current network is combinational.\n";
                }
                else {
                  iVar5 = pAVar4->vPis->nSize;
                  if (iVar5 != 0) {
                    if (bVar1) {
                      p = pAbc->pCex;
                      if (p == (Abc_Cex_t *)0x0) {
                        pcVar6 = "Counter-example is not available.\n";
                      }
                      else {
                        if (p->nPis % iVar5 == 0) {
                          pCexNew = Abc_CexTransformTempor
                                              (p,iVar5,pAVar4->vPos->nSize,pAVar4->nObjCounts[8]);
                          Abc_FrameReplaceCex(pAbc,&pCexNew);
                          return 0;
                        }
                        pcVar6 = 
                        "PI count of the CEX is not a multiple of PI count of the current AIG.\n";
                      }
                    }
                    else {
                      pAVar4 = Abc_NtkDarTempor(pAVar4,nFrames,local_6c,local_68,local_64,local_60,
                                                fVerbose,fVeryVerbose);
                      if (pAVar4 != (Abc_Ntk_t *)0x0) {
                        Abc_FrameReplaceCurrentNetwork(pAbc,pAVar4);
                        return 0;
                      }
                      pcVar6 = "Temporal decomposition has failed.\n";
                    }
                    iVar5 = -1;
                    goto LAB_0020e2e0;
                  }
                  pcVar6 = "The current network does not have primary inputs. Use \"addpi\".\n";
                }
                iVar5 = 0;
                goto LAB_0020e326;
              }
              pcVar6 = "The current network is not an AIG (run \"strash\").\n";
            }
            iVar5 = -2;
LAB_0020e326:
            Abc_Print(iVar5,pcVar6);
            return 0;
          }
          goto LAB_0020e1cf;
        }
        fVeryVerbose = fVeryVerbose ^ 1;
      }
      goto LAB_0020e03a;
    }
    if (globalUtilOptind < argc) {
      local_6c = atoi(argv[globalUtilOptind]);
      uVar3 = local_6c;
      goto joined_r0x0020e128;
    }
    pcVar6 = "Command line switch \"-T\" should be followed by an integer.\n";
  }
LAB_0020e1c5:
  Abc_Print(-1,pcVar6);
  goto LAB_0020e1cf;
}

Assistant:

int Abc_CommandTempor( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkDarTempor( Abc_Ntk_t * pNtk, int nFrames, int TimeOut, int nConfLimit, int fUseBmc, int fUseTransSigs, int fVerbose, int fVeryVerbose );
    Abc_Ntk_t * pNtkRes, * pNtk = Abc_FrameReadNtk(pAbc);
    int nFrames       =       0;
    int TimeOut       =     300;
    int nConfMax      =  100000;
    int fUseBmc       =       1;
    int fUseTransSigs =       0;
    int fUpdateCex    =       0;
    int fVerbose      =       0;
    int fVeryVerbose  =       0;
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FTCbscvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            TimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( TimeOut < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfMax < 0 )
                goto usage;
            break;
        case 'b':
            fUseBmc ^= 1;
            break;
        case 's':
            fUseTransSigs ^= 1;
            break;
        case 'c':
            fUpdateCex ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -2, "There is no current network.\n");
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -2, "The current network is not an AIG (run \"strash\").\n");
        return 0;
    }
    if ( Abc_NtkLatchNum(pNtk) == 0 )
    {
        Abc_Print( 0, "The current network is combinational.\n");
        return 0;
    }
    if ( Abc_NtkPiNum(pNtk) == 0 )
    {
        Abc_Print( 0, "The current network does not have primary inputs. Use \"addpi\".\n");
        return 0;
    }
    if ( fUpdateCex )
    {
        Abc_Cex_t * pCexNew;
        if ( pAbc->pCex == NULL )
        {
            Abc_Print( -1, "Counter-example is not available.\n" );
            return 1;
        }
        if ( pAbc->pCex->nPis % Abc_NtkPiNum(pNtk) != 0 )
        {
            Abc_Print( -1, "PI count of the CEX is not a multiple of PI count of the current AIG.\n" );
            return 1;
        }
        pCexNew = Abc_CexTransformTempor( pAbc->pCex, Abc_NtkPiNum(pNtk), Abc_NtkPoNum(pNtk), Abc_NtkLatchNum(pNtk) );
        Abc_FrameReplaceCex( pAbc, &pCexNew );
        return 0;
    }
    // modify the current network
    pNtkRes = Abc_NtkDarTempor( pNtk, nFrames, TimeOut, nConfMax, fUseBmc, fUseTransSigs, fVerbose, fVeryVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Temporal decomposition has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: tempor [-FTC <num>] [-bscvwh]\n" );
    Abc_Print( -2, "\t           performs temporal decomposition\n" );
    Abc_Print( -2, "\t-F <num> : init logic timeframe count (0 = use leading length) [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-T <num> : runtime limit in seconds for BMC (0=unused) [default = %d]\n", TimeOut );
    Abc_Print( -2, "\t-C <num> : max number of SAT conflicts in BMC (0=unused) [default = %d]\n", nConfMax );
    Abc_Print( -2, "\t-b       : toggle running BMC2 on the init frames [default = %s]\n", fUseBmc? "yes": "no" );
    Abc_Print( -2, "\t-s       : toggle using transient signals [default = %s]\n", fUseTransSigs? "yes": "no" );
    Abc_Print( -2, "\t-c       : update the current CEX derived for a new AIG after \"tempor\"\n" );
    Abc_Print( -2, "\t           to match the current AIG (the one before \"tempor\") [default = %s]\n", fUpdateCex? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle printing verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle printing ternary state space [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}